

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cpp
# Opt level: O0

void __thiscall CMU462::DynamicScene::Mesh::split_selected_edge(Mesh *this)

{
  HalfedgeElement *this_00;
  Edge *this_01;
  HalfedgeIter *this_02;
  pointer this_03;
  EdgeIter *pEVar1;
  VertexIter v_00;
  Vertex *pVVar2;
  VertexIter v;
  Edge *edge;
  HalfedgeElement *element;
  Mesh *this_local;
  
  if ((((this->super_SceneObject).scene != (Scene *)0x0) &&
      (this_00 = (((this->super_SceneObject).scene)->selected).element,
      this_00 != (HalfedgeElement *)0x0)) &&
     (this_01 = HalfedgeElement::getEdge(this_00), this_01 != (Edge *)0x0)) {
    this_02 = Edge::halfedge(this_01);
    this_03 = std::_List_iterator<CMU462::Halfedge>::operator->(this_02);
    pEVar1 = Halfedge::edge(this_03);
    v_00 = HalfedgeMesh::splitEdge(&this->mesh,pEVar1->_M_node);
    pVVar2 = elementAddress(v_00);
    (((this->super_SceneObject).scene)->selected).element = &pVVar2->super_HalfedgeElement;
    Selection::clear(&((this->super_SceneObject).scene)->hovered);
    Selection::clear(&((this->super_SceneObject).scene)->elementTransform->target);
  }
  return;
}

Assistant:

void Mesh::split_selected_edge() {
   if( scene == nullptr ) return;
   HalfedgeElement *element = scene->selected.element;
   if (element == nullptr) return;
   Edge *edge = element->getEdge();
   if (edge == nullptr) return;
   VertexIter v = mesh.splitEdge(edge->halfedge()->edge());
   scene->selected.element = elementAddress( v );
   scene->hovered.clear();
   scene->elementTransform->target.clear();
}